

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FalseTests.cpp
# Opt level: O0

void __thiscall IsFalseTests::IsFalseTests(IsFalseTests *this)

{
  IsFalseTests *this_local;
  
  ut11::TestFixture::TestFixture(&this->super_TestFixture);
  (this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract =
       (_func_int **)&PTR__IsFalseTests_006146b0;
  return;
}

Assistant:

virtual void Run()
	{
		Then("Is::False(false) is true", []() {
			AssertThat(ut11::Is::False(false), ut11::Is::True);
		});

		Then("Is::False(true) is not true", []() {
			AssertThat(ut11::Is::False(true), ut11::Is::Not::True);
		});

		Then("Is::False has an error message", []() {
			AssertThat(ut11::Is::False.GetErrorMessage(true), ut11::Is::Not::EqualTo(""));
		});

		Then("Is::Not::False(true) is true", []() {
			AssertThat(ut11::Is::Not::False(true), ut11::Is::True);
		});

		Then("Is::Not::False(false) is not true", []() {
			AssertThat(ut11::Is::Not::False(false), ut11::Is::Not::True);
		});

		Then("Is::False returns an Operand", []() {
			AssertThat( ut11::detail::IsOperand<decltype(ut11::Is::False)>::value, ut11::Is::True );
		});

		Then("Is::Not::False returns an Operand", []() {
			AssertThat( ut11::detail::IsOperand<decltype(ut11::Is::Not::False)>::value, ut11::Is::True );
		});

		Then("Is::Not::False has an error message", []() {
			AssertThat(ut11::Is::Not::False.GetErrorMessage(false), ut11::Is::Not::EqualTo(""));
		});
	}